

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfsfileengine_unix.cpp
# Opt level: O2

bool __thiscall
QFSFileEnginePrivate::nativeOpen
          (QFSFileEnginePrivate *this,OpenMode openMode,
          optional<QFlags<QFileDevice::Permission>_> permissions)

{
  bool bVar1;
  mode_t mode;
  QFlags<QFileDevice::Permission> *pQVar2;
  long in_FS_OFFSET;
  _Optional_payload_base<QFlags<QFileDevice::Permission>_> local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  mode = 0x1b6;
  local_20 = (_Optional_payload_base<QFlags<QFileDevice::Permission>_>)
             permissions.super__Optional_base<QFlags<QFileDevice::Permission>,_true,_true>.
             _M_payload.super__Optional_payload_base<QFlags<QFileDevice::Permission>_>;
  if (((ulong)permissions.super__Optional_base<QFlags<QFileDevice::Permission>,_true,_true>.
              _M_payload.super__Optional_payload_base<QFlags<QFileDevice::Permission>_> >> 0x20 & 1)
      != 0) {
    pQVar2 = std::
             _Optional_base_impl<QFlags<QFileDevice::Permission>,_std::_Optional_base<QFlags<QFileDevice::Permission>,_true,_true>_>
             ::_M_get((_Optional_base_impl<QFlags<QFileDevice::Permission>,_std::_Optional_base<QFlags<QFileDevice::Permission>,_true,_true>_>
                       *)&local_20);
    mode = QtPrivate::toMode_t((Permissions)
                               (pQVar2->super_QFlagsStorageHelper<QFileDevice::Permission,_4>).
                               super_QFlagsStorage<QFileDevice::Permission>.i);
  }
  bVar1 = nativeOpenImpl(this,openMode,mode);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool QFSFileEnginePrivate::nativeOpen(QIODevice::OpenMode openMode,
                                      std::optional<QFile::Permissions> permissions)
{
    return nativeOpenImpl(openMode, permissions ? QtPrivate::toMode_t(*permissions) : 0666);
}